

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_gains.hpp
# Opt level: O0

void __thiscall ear::OutputGainsT<double>::zero(OutputGainsT<double> *this)

{
  double local_28;
  double *local_20;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_18;
  OutputGainsT<double> *local_10;
  OutputGainsT<double> *this_local;
  
  local_10 = this;
  local_18._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(this->vec);
  local_20 = (double *)std::vector<double,_std::allocator<double>_>::end(this->vec);
  local_28 = 0.0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (local_18,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      local_20,&local_28);
  return;
}

Assistant:

virtual void zero() override { std::fill(vec.begin(), vec.end(), (T)0.0); }